

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsystemtrayicon.cpp
# Opt level: O0

void QSystemTrayIcon::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  ActivationReason in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QSystemTrayIcon *_t;
  undefined4 in_stack_ffffffffffffff78;
  ActivationReason in_stack_ffffffffffffff7c;
  QSystemTrayIconPrivate *in_stack_ffffffffffffff80;
  QSystemTrayIcon *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QIcon *this;
  int msecs;
  QString *in_stack_ffffffffffffff98;
  MessageIcon msgIcon;
  QString *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  QSystemTrayIcon *in_stack_ffffffffffffffb0;
  QIcon local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff80 = (QSystemTrayIconPrivate *)(ulong)in_EDX;
    msecs = (int)in_stack_ffffffffffffff98;
    msgIcon = (MessageIcon)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    switch(in_stack_ffffffffffffff80) {
    case (QSystemTrayIconPrivate *)0x0:
      activated((QSystemTrayIcon *)0x492361,in_stack_ffffffffffffff7c);
      break;
    case (QSystemTrayIconPrivate *)0x1:
      messageClicked((QSystemTrayIcon *)0x492370);
      break;
    case (QSystemTrayIconPrivate *)0x2:
      setVisible(in_stack_ffffffffffffff88,false);
      break;
    case (QSystemTrayIconPrivate *)0x3:
      show((QSystemTrayIcon *)0x49239e);
      break;
    case (QSystemTrayIconPrivate *)0x4:
      hide((QSystemTrayIcon *)0x4923ad);
      break;
    case (QSystemTrayIconPrivate *)0x5:
      showMessage((QSystemTrayIcon *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff90,(QIcon *)in_stack_ffffffffffffff88,0);
      break;
    case (QSystemTrayIconPrivate *)0x6:
      showMessage((QSystemTrayIcon *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff90,(QIcon *)in_stack_ffffffffffffff88,0);
      break;
    case (QSystemTrayIconPrivate *)0x7:
      showMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  msgIcon,msecs);
      break;
    case (QSystemTrayIconPrivate *)0x8:
      showMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  msgIcon,msecs);
      break;
    case (QSystemTrayIconPrivate *)0x9:
      showMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  msgIcon,msecs);
      break;
    case (QSystemTrayIconPrivate *)0xa:
      d_func((QSystemTrayIcon *)0x4924af);
      QSystemTrayIconPrivate::_q_emitActivated(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
  }
  if ((in_ESI != 5) ||
     ((bVar1 = QtMocHelpers::
               indexOfMethod<void(QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason)>
                         (in_RCX,(void **)activated,0,0), !bVar1 &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QSystemTrayIcon::*)()>
                         (in_RCX,(void **)messageClicked,0,1), !bVar1)))) {
    if (in_ESI == 1) {
      this = *(QIcon **)in_RCX;
      in_stack_ffffffffffffff7c = in_EDX;
      if (in_EDX == Unknown) {
        toolTip(in_stack_ffffffffffffff88);
        QString::operator=((QString *)in_stack_ffffffffffffff80,
                           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        QString::~QString((QString *)0x4925a4);
      }
      else if (in_EDX == Context) {
        icon(in_stack_ffffffffffffff88);
        QIcon::operator=(this,(QIcon *)in_stack_ffffffffffffff88);
        QIcon::~QIcon(local_28);
      }
      else if (in_EDX == DoubleClick) {
        bVar1 = isVisible((QSystemTrayIcon *)in_stack_ffffffffffffff80);
        *(bool *)&this->d = bVar1;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == Unknown) {
        setToolTip((QSystemTrayIcon *)in_stack_ffffffffffffff80,
                   (QString *)((ulong)in_stack_ffffffffffffff7c << 0x20));
      }
      else if (in_EDX == Context) {
        setIcon((QSystemTrayIcon *)in_stack_ffffffffffffff80,
                (QIcon *)CONCAT44(in_stack_ffffffffffffff7c,1));
      }
      else if (in_EDX == DoubleClick) {
        setVisible(*(QSystemTrayIcon **)in_RCX,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemTrayIcon::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSystemTrayIcon *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        case 1: _t->messageClicked(); break;
        case 2: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->show(); break;
        case 4: _t->hide(); break;
        case 5: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 6: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3]))); break;
        case 7: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 8: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3]))); break;
        case 9: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->d_func()->_q_emitActivated((*reinterpret_cast< std::add_pointer_t<QPlatformSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason )>(_a, &QSystemTrayIcon::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)()>(_a, &QSystemTrayIcon::messageClicked, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}